

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetMicroRep_Test::
MicroStringPrevTest_AssignmentViaSetMicroRep_Test
          (MicroStringPrevTest_AssignmentViaSetMicroRep_Test *this)

{
  MicroStringPrevTest_AssignmentViaSetMicroRep_Test *this_local;
  
  MicroStringPrevTest::MicroStringPrevTest(&this->super_MicroStringPrevTest);
  (this->super_MicroStringPrevTest).
  super_TestWithParam<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
  .super_Test._vptr_Test =
       (_func_int **)&PTR__MicroStringPrevTest_AssignmentViaSetMicroRep_Test_029dcf88;
  (this->super_MicroStringPrevTest).
  super_TestWithParam<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
  .
  super_WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
  ._vptr_WithParamInterface = (_func_int **)&DAT_029dcfc8;
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetMicroRep) {
  MicroString source = MakeFromState(kMicroRep, arena());

  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  const bool will_reuse = str_.Capacity() >= source.Get().size();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kMicroRepSize + str_.Get().size());
  }

  if (!has_arena()) source.Destroy();
}